

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int side2_8d_filter(double *p0,double *p1,double *p2,double *q0,double *q1)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar9;
  undefined1 auVar8 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  
  dVar25 = p0[2];
  dVar38 = p0[3];
  dVar44 = p0[4];
  dVar31 = p0[5];
  dVar22 = p0[6];
  dVar49 = p0[7];
  dVar33 = q0[2] - dVar25;
  dVar29 = q0[3] - dVar38;
  dVar24 = q0[4] - dVar44;
  dVar20 = q0[5] - dVar31;
  dVar39 = q0[6] - dVar22;
  dVar14 = *p0;
  dVar35 = p0[1];
  dVar5 = *q0 - dVar14;
  dVar9 = q0[1] - dVar35;
  dVar13 = ABS(dVar9);
  if (ABS(dVar9) <= ABS(dVar5)) {
    dVar13 = ABS(dVar5);
  }
  dVar34 = ABS(dVar33);
  if (ABS(dVar33) <= dVar13) {
    dVar34 = dVar13;
  }
  dVar13 = ABS(dVar29);
  if (ABS(dVar29) <= dVar34) {
    dVar13 = dVar34;
  }
  dVar34 = ABS(dVar24);
  if (ABS(dVar24) <= dVar13) {
    dVar34 = dVar13;
  }
  dVar13 = ABS(dVar20);
  if (ABS(dVar20) <= dVar34) {
    dVar13 = dVar34;
  }
  dVar34 = ABS(dVar39);
  if (ABS(dVar39) <= dVar13) {
    dVar34 = dVar13;
  }
  dVar11 = q0[7] - dVar49;
  dVar13 = ABS(dVar11);
  if (ABS(dVar11) <= dVar34) {
    dVar13 = dVar34;
  }
  dVar6 = *q1 - dVar14;
  dVar34 = ABS(dVar6);
  if (ABS(dVar6) <= dVar13) {
    dVar34 = dVar13;
  }
  dVar12 = p1[4] - dVar44;
  auVar15._0_8_ = ABS(dVar12);
  auVar15._8_8_ = dVar34;
  dVar40 = p1[3] - dVar38;
  dVar41 = q1[1] - dVar35;
  auVar19._0_8_ = ABS(dVar40);
  auVar19._8_8_ = ABS(dVar41);
  auVar8 = maxpd(auVar19,auVar15);
  dVar30 = p1[7] - dVar49;
  dVar32 = q1[2] - dVar25;
  auVar16._0_8_ = ABS(dVar30);
  auVar16._8_8_ = ABS(dVar32);
  auVar8 = maxpd(auVar16,auVar8);
  dVar7 = p1[1] - dVar35;
  dVar10 = q1[6] - dVar22;
  dVar50 = p1[2] - dVar25;
  dVar51 = q1[5] - dVar31;
  dVar47 = p1[5] - dVar31;
  dVar48 = q1[7] - dVar49;
  dVar36 = p1[6] - dVar22;
  dVar37 = q1[4] - dVar44;
  dVar42 = q1[3] - dVar38;
  dVar21 = *p1 - dVar14;
  auVar27._0_8_ = ABS(dVar21);
  auVar27._8_8_ = ABS(dVar42);
  auVar8 = maxpd(auVar27,auVar8);
  auVar17._0_8_ = ABS(dVar36);
  auVar17._8_8_ = ABS(dVar37);
  auVar8 = maxpd(auVar17,auVar8);
  auVar28._0_8_ = ABS(dVar50);
  auVar28._8_8_ = ABS(dVar51);
  auVar8 = maxpd(auVar28,auVar8);
  auVar18._0_8_ = ABS(dVar7);
  auVar18._8_8_ = ABS(dVar10);
  auVar19 = maxpd(auVar18,auVar8);
  auVar8._0_8_ = ABS(dVar47);
  auVar8._8_8_ = ABS(dVar48);
  auVar8 = maxpd(auVar8,auVar19);
  dVar3 = auVar8._0_8_;
  dVar4 = auVar8._8_8_;
  dVar13 = dVar4;
  dVar34 = dVar3;
  if ((dVar4 <= dVar3) && (dVar34 = dVar4, dVar4 < dVar3)) {
    dVar13 = dVar3;
  }
  iVar1 = 0;
  iVar2 = 0;
  if ((1.1554293109153009e-147 <= dVar34) && (iVar2 = iVar1, dVar13 <= 1.8707220957835553e+50)) {
    dVar13 = dVar30 * dVar11 +
             dVar36 * dVar39 +
             dVar47 * dVar20 +
             dVar12 * dVar24 + dVar40 * dVar29 + dVar50 * dVar33 + dVar21 * dVar5 + dVar7 * dVar9;
    dVar34 = dVar30 * dVar48 +
             dVar36 * dVar10 +
             dVar47 * dVar51 +
             dVar12 * dVar37 + dVar40 * dVar42 + dVar50 * dVar32 + dVar21 * dVar6 + dVar7 * dVar41;
    dVar13 = dVar13 + dVar13;
    dVar34 = dVar34 + dVar34;
    dVar43 = dVar34 - dVar13;
    dVar46 = dVar3 * dVar4 * 1.6667009016668223e-14;
    if (dVar43 <= dVar46) {
      if (-dVar46 <= dVar43) {
        return 0;
      }
      iVar1 = -1;
    }
    else {
      iVar1 = 1;
    }
    dVar14 = *p2 - dVar14;
    dVar35 = p2[1] - dVar35;
    dVar25 = p2[2] - dVar25;
    dVar38 = p2[3] - dVar38;
    dVar44 = p2[4] - dVar44;
    dVar31 = p2[5] - dVar31;
    dVar22 = p2[6] - dVar22;
    dVar49 = p2[7] - dVar49;
    dVar46 = dVar3;
    if (dVar3 <= dVar4) {
      dVar46 = dVar4;
    }
    dVar23 = ABS(dVar44);
    if (ABS(dVar44) <= dVar4) {
      dVar23 = dVar4;
    }
    dVar4 = ABS(dVar25);
    if (ABS(dVar25) <= dVar23) {
      dVar4 = dVar23;
    }
    dVar23 = ABS(dVar14);
    if (ABS(dVar14) <= dVar4) {
      dVar23 = dVar4;
    }
    dVar4 = ABS(dVar35);
    if (ABS(dVar35) <= dVar23) {
      dVar4 = dVar23;
    }
    dVar23 = ABS(dVar38);
    if (ABS(dVar38) <= dVar4) {
      dVar23 = dVar4;
    }
    dVar4 = ABS(dVar31);
    if (ABS(dVar31) <= dVar23) {
      dVar4 = dVar23;
    }
    dVar23 = ABS(dVar22);
    if (ABS(dVar22) <= dVar4) {
      dVar23 = dVar4;
    }
    dVar4 = ABS(dVar49);
    if (ABS(dVar49) <= dVar23) {
      dVar4 = dVar23;
    }
    dVar23 = dVar4;
    if (dVar4 <= dVar46) {
      dVar23 = dVar46;
    }
    dVar46 = dVar23;
    dVar26 = dVar3;
    if ((dVar3 <= dVar23) && (dVar46 = dVar3, dVar3 < dVar23)) {
      dVar26 = dVar23;
    }
    dVar45 = dVar4;
    if (dVar46 <= dVar4) {
      dVar45 = dVar46;
    }
    if ((1.2641951066311592e-74 <= dVar45) && (dVar26 <= 1.8707220957835553e+50)) {
      dVar7 = dVar30 * dVar30 +
              dVar36 * dVar36 +
              dVar47 * dVar47 +
              dVar12 * dVar12 + dVar40 * dVar40 + dVar50 * dVar50 + dVar21 * dVar21 + dVar7 * dVar7;
      dVar38 = (dVar48 * dVar49 +
               dVar10 * dVar22 +
               dVar51 * dVar31 +
               dVar37 * dVar44 +
               dVar42 * dVar38 + dVar32 * dVar25 + dVar6 * dVar14 + dVar41 * dVar35) * -2.0 *
               (dVar7 - dVar13) +
               dVar43 * (dVar49 * dVar49 +
                        dVar22 * dVar22 +
                        dVar31 * dVar31 +
                        dVar44 * dVar44 +
                        dVar38 * dVar38 + dVar25 * dVar25 + dVar14 * dVar14 + dVar35 * dVar35) +
               (dVar34 - dVar7) *
               (dVar11 * dVar49 +
               dVar39 * dVar22 +
               dVar20 * dVar31 +
               dVar24 * dVar44 + dVar29 * dVar38 + dVar33 * dVar25 + dVar5 * dVar14 + dVar9 * dVar35
               ) * -2.0;
      dVar25 = dVar3 * dVar4 * dVar4 * dVar23 * 8.711401122557855e-13;
      if (dVar38 <= dVar25) {
        if (-dVar25 <= dVar38) {
          return 0;
        }
        iVar2 = -1;
      }
      else {
        iVar2 = 1;
      }
      iVar2 = iVar2 * iVar1;
    }
  }
  return iVar2;
}

Assistant:

inline int side2_8d_filter( const double* p0, const double* p1, const double* p2, const double* q0, const double* q1) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double l1;
    l1 = (1 * ((((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)) + (p1_7_p0_7 * p1_7_p0_7)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double p2_7_p0_7 = (p2[7] - p0[7]);
    double l2;
    l2 = (1 * ((((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)) + (p2_7_p0_7 * p2_7_p0_7)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    double a10;
    a10 = (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double q1_7_p0_7 = (q1[7] - p0[7]);
    double a11;
    a11 = (2 * ((((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)) + (p1_7_p0_7 * q1_7_p0_7)));
    double a20;
    a20 = (2 * ((((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)) + (p2_7_p0_7 * q0_7_p0_7)));
    double a21;
    a21 = (2 * ((((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)) + (p2_7_p0_7 * q1_7_p0_7)));
    double Delta;
    Delta = (a11 - a10);
    double DeltaLambda0;
    DeltaLambda0 = (a11 - l1);
    double DeltaLambda1;
    DeltaLambda1 = (l1 - a10);
    double r;
    r = (((Delta * l2) - (a20 * DeltaLambda0)) - (a21 * DeltaLambda1));
    double eps;
    double max1 = fabs(p1_4_p0_4);
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_7_p0_7)) )
    {
        max1 = fabs(p1_7_p0_7);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    double max2 = fabs(q0_0_p0_0);
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    if( (max2 < fabs(q0_7_p0_7)) )
    {
        max2 = fabs(q0_7_p0_7);
    } 
    if( (max2 < fabs(q1_0_p0_0)) )
    {
        max2 = fabs(q1_0_p0_0);
    } 
    if( (max2 < fabs(q1_1_p0_1)) )
    {
        max2 = fabs(q1_1_p0_1);
    } 
    if( (max2 < fabs(q1_2_p0_2)) )
    {
        max2 = fabs(q1_2_p0_2);
    } 
    if( (max2 < fabs(q1_3_p0_3)) )
    {
        max2 = fabs(q1_3_p0_3);
    } 
    if( (max2 < fabs(q1_4_p0_4)) )
    {
        max2 = fabs(q1_4_p0_4);
    } 
    if( (max2 < fabs(q1_5_p0_5)) )
    {
        max2 = fabs(q1_5_p0_5);
    } 
    if( (max2 < fabs(q1_6_p0_6)) )
    {
        max2 = fabs(q1_6_p0_6);
    } 
    if( (max2 < fabs(q1_7_p0_7)) )
    {
        max2 = fabs(q1_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (lower_bound_1 < 1.15542931091530087067e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.87072209578355531992e+50) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66670090166682227006e-14 * (max1 * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max3 = max2;
    if( (max3 < max1) )
    {
        max3 = max1;
    } 
    double max4 = max2;
    if( (max4 < fabs(p2_4_p0_4)) )
    {
        max4 = fabs(p2_4_p0_4);
    } 
    if( (max4 < fabs(p2_2_p0_2)) )
    {
        max4 = fabs(p2_2_p0_2);
    } 
    if( (max4 < fabs(p2_0_p0_0)) )
    {
        max4 = fabs(p2_0_p0_0);
    } 
    if( (max4 < fabs(p2_1_p0_1)) )
    {
        max4 = fabs(p2_1_p0_1);
    } 
    if( (max4 < fabs(p2_3_p0_3)) )
    {
        max4 = fabs(p2_3_p0_3);
    } 
    if( (max4 < fabs(p2_5_p0_5)) )
    {
        max4 = fabs(p2_5_p0_5);
    } 
    if( (max4 < fabs(p2_6_p0_6)) )
    {
        max4 = fabs(p2_6_p0_6);
    } 
    if( (max4 < fabs(p2_7_p0_7)) )
    {
        max4 = fabs(p2_7_p0_7);
    } 
    if( (max3 < max4) )
    {
        max3 = max4;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    if( (lower_bound_1 < 1.26419510663115923609e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.87072209578355531992e+50) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (8.71140112255785451890e-13 * (((max1 * max4) * max4) * max3));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}